

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O2

Diagnostics * __thiscall
slang::analysis::AnalysisManager::getDiagnostics
          (Diagnostics *__return_storage_ptr__,AnalysisManager *this,SourceManager *sourceManager)

{
  Diagnostics *pDVar1;
  long lVar2;
  Diagnostic *pDVar3;
  pointer pWVar4;
  bool _;
  ASTDiagMap diagMap;
  bool local_e9;
  SourceManager *local_e8;
  Diagnostics *local_e0;
  pointer local_d8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  local_d0;
  Diagnostic local_a0;
  
  local_e8 = sourceManager;
  local_e0 = __return_storage_ptr__;
  wait(this,this);
  boost::unordered::
  unordered_flat_map<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
              *)&local_d0);
  local_d8 = (this->workerStates).
             super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (pWVar4 = (this->workerStates).
                super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
                ._M_impl.super__Vector_impl_data._M_start; pDVar1 = local_e0, pWVar4 != local_d8;
      pWVar4 = pWVar4 + 1) {
    pDVar3 = (pWVar4->context).diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.data_;
    for (lVar2 = (pWVar4->context).diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                 super_SmallVectorBase<slang::Diagnostic>.len * 0x70; lVar2 != 0;
        lVar2 = lVar2 + -0x70) {
      Diagnostic::Diagnostic(&local_a0,pDVar3);
      ast::ASTDiagMap::add((ASTDiagMap *)&local_d0,&local_a0,&local_e9);
      Diagnostic::~Diagnostic(&local_a0);
      pDVar3 = pDVar3 + 1;
    }
  }
  ast::ASTDiagMap::coalesce(local_e0,(ASTDiagMap *)&local_d0,local_e8);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  ::~table_core(&local_d0);
  return pDVar1;
}

Assistant:

Diagnostics AnalysisManager::getDiagnostics(const SourceManager* sourceManager) {
    wait();

    ASTDiagMap diagMap;
    for (auto& state : workerStates) {
        for (auto& diag : state.context.diagnostics) {
            bool _;
            diagMap.add(diag, _);
        }
    }

    return diagMap.coalesce(sourceManager);
}